

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t sse42_despace_branchless_lookup(char *bytes,size_t howmany)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char c;
  undefined8 uStack_e8;
  int mask16;
  __m128i x;
  ulong local_d0;
  size_t i;
  __m128i targetchars;
  size_t local_b0;
  size_t pos;
  size_t howmany_local;
  char *bytes_local;
  uint local_28;
  
  local_b0 = 0;
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0xd,1);
  auVar2 = vpinsrb_avx(auVar2,10,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0xd,5);
  auVar2 = vpinsrb_avx(auVar2,10,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0xd,9);
  auVar2 = vpinsrb_avx(auVar2,10,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xd);
  auVar2 = vpinsrb_avx(auVar2,10,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
  for (local_d0 = 0; local_d0 + 0xf < howmany; local_d0 = local_d0 + 0x10) {
    vpcmpestrm_avx(auVar2,*(undefined1 (*) [16])(bytes + local_d0),0);
    local_28 = auVar2._0_4_;
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])(bytes + local_d0),
                         *(undefined1 (*) [16])("" + (long)(int)(local_28 & 0x7fff) * 0x10));
    uStack_e8 = auVar3._0_8_;
    x[0] = auVar3._8_8_;
    *(undefined8 *)(bytes + local_b0) = uStack_e8;
    *(longlong *)(bytes + local_b0 + 8) = x[0];
    local_b0 = (long)(0x10 - ""[(int)local_28]) + local_b0;
  }
  for (; local_d0 < howmany; local_d0 = local_d0 + 1) {
    cVar1 = bytes[local_d0];
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      bytes[local_b0] = cVar1;
      local_b0 = local_b0 + 1;
    }
  }
  return local_b0;
}

Assistant:

size_t sse42_despace_branchless_lookup(char *bytes,
                                                     size_t howmany) {
  size_t pos = 0;
  __m128i targetchars =
      _mm_set_epi8(' ', '\n', '\r', ' ', ' ', '\n', '\r', ' ', ' ', '\n', '\r',
                   ' ', ' ', '\n', '\r', ' ');
  size_t i = 0;
  for (; i + 15 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16 = _mm_cvtsi128_si32(
        _mm_cmpestrm(targetchars, 3, x, 16,
                     _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK));
    x = _mm_shuffle_epi8(
        x, _mm_loadu_si128((const __m128i *)despace_mask16 + (mask16 & 0x7fff)));
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - despace_popcnt16[mask16];
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}